

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

bool __thiscall
kratos::InsertClockIRVisitor::has_clk_en_stmt(InsertClockIRVisitor *this,StmtBlock *block)

{
  int iVar1;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  __type_conflict2 _Var4;
  byte bVar5;
  undefined1 local_58 [8];
  shared_ptr<kratos::Stmt> stmt;
  shared_ptr<kratos::Var> cond;
  shared_ptr<kratos::IfStmt> if_;
  shared_ptr<kratos::Port> p;
  
  p_Var2 = &((block->stmts_).
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
  if (p_Var2 != &((block->stmts_).
                  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>) {
    std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)local_58,p_Var2);
    if (*(StatementType *)((long)local_58 + 0x78) == If) {
      Stmt::as<kratos::IfStmt>
                ((Stmt *)&cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 (cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 + 0xc));
      if (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[0x16].
          _M_use_count == 6) {
        Var::as<kratos::VarCasted>
                  ((Var *)&if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
        this = (InsertClockIRVisitor *)
               (ulong)(*(int *)&if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi[0x28]._vptr__Sp_counted_base == 4);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
LAB_001f69ae:
        bVar3 = false;
      }
      else {
        if (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            [0x16]._M_use_count == 4) {
          Var::as<kratos::Port>
                    ((Var *)&if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
          iVar1 = *(int *)((long)&if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi[0x27]._vptr__Sp_counted_base + 4);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
          if (iVar1 == 4) {
            bVar3 = false;
            this = (InsertClockIRVisitor *)0x1;
            goto LAB_001f69b8;
          }
        }
        else {
          _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&stmt.
                                      super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi[7]._M_use_count,&this->clk_en_name_);
          if (_Var4) {
            this = (InsertClockIRVisitor *)0x1;
            goto LAB_001f69ae;
          }
        }
        this = (InsertClockIRVisitor *)0x1;
        bVar3 = true;
      }
LAB_001f69b8:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cond);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_);
    }
    else {
      bVar3 = true;
    }
    bVar5 = (byte)this;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
    if (!bVar3) goto LAB_001f69da;
  }
  bVar5 = 0;
LAB_001f69da:
  return (bool)(bVar5 & 1);
}

Assistant:

bool has_clk_en_stmt(StmtBlock* block) const {
        if (!block->empty()) {
            auto stmt = block->get_stmt(0);
            if (stmt->type() == StatementType::If) {
                auto if_ = stmt->as<IfStmt>();
                auto cond = if_->predicate();
                if (cond->type() == VarType::PortIO) {
                    auto p = cond->as<Port>();
                    if (p->port_type() == PortType::ClockEnable) {
                        return true;
                    }
                } else if (cond->type() == VarType::BaseCasted) {
                    auto casted = cond->as<VarCasted>();
                    return casted->cast_type() == VarCastType::ClockEnable;
                } else if (cond->name == clk_en_name_) {
                    return true;
                }
            }
        }
        return false;
    }